

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O2

int Fl::screen_num(int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int n;
  int iVar7;
  float fVar8;
  int sh;
  int sw;
  int sy;
  int sx;
  float local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar5 = w + x;
  iVar4 = h + y;
  n = 0;
  local_44 = 0.0;
  iVar7 = 0;
  while( true ) {
    iVar1 = screen_count();
    if (iVar1 <= n) break;
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    screen_xywh(&local_34,&local_38,&local_3c,&local_40,n);
    fVar8 = 0.0;
    if (((local_34 <= iVar5) && (iVar1 = local_3c + local_34, local_38 <= iVar4 && x <= iVar1)) &&
       (iVar6 = local_40 + local_38, y <= iVar6)) {
      iVar2 = local_34;
      if (local_34 < x) {
        iVar2 = x;
      }
      if (iVar5 < iVar1) {
        iVar1 = iVar5;
      }
      iVar3 = local_38;
      if (local_38 < y) {
        iVar3 = y;
      }
      if (iVar4 < iVar6) {
        iVar6 = iVar4;
      }
      fVar8 = (float)(iVar6 - iVar3) * (float)(iVar1 - iVar2);
    }
    iVar1 = n;
    if (fVar8 <= local_44) {
      fVar8 = local_44;
      iVar1 = iVar7;
    }
    n = n + 1;
    local_44 = fVar8;
    iVar7 = iVar1;
  }
  return iVar7;
}

Assistant:

int Fl::screen_num(int x, int y, int w, int h) {
  int best_screen = 0;
  float best_intersection = 0.;
  for (int i = 0; i < Fl::screen_count(); i++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    float sintersection = fl_intersection(x, y, w, h, sx, sy, sw, sh);
    if (sintersection > best_intersection) {
      best_screen = i;
      best_intersection = sintersection;
    }
  }
  return best_screen;
}